

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O2

int read_next_symbol(archive_read *a,huffman_code *code)

{
  rar_br *br;
  uint uVar1;
  void *pvVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  huffman_table_entry *table;
  uint uVar7;
  huffman_tree_node *phVar9;
  ulong uVar8;
  
  if (code->table == (huffman_table_entry *)0x0) {
    iVar6 = code->maxlength;
    iVar5 = 10;
    if (iVar6 < 10) {
      iVar5 = iVar6;
    }
    if (iVar6 < code->minlength) {
      iVar5 = 10;
    }
    code->tablesize = iVar5;
    table = (huffman_table_entry *)calloc(1,8L << ((byte)iVar5 & 0x3f));
    code->table = table;
    iVar6 = make_table_recurse(a,code,0,table,0,iVar5);
    if (iVar6 != 0) {
      return -1;
    }
  }
  pvVar2 = a->format->data;
  br = (rar_br *)((long)pvVar2 + 0x4ec8);
  iVar6 = *(int *)((long)pvVar2 + 0x4ed0);
  iVar5 = code->tablesize;
  if (iVar6 < iVar5) {
    iVar3 = rar_br_fillup(a,br);
    iVar6 = *(int *)((long)pvVar2 + 0x4ed0);
    iVar5 = code->tablesize;
    if (iVar6 < iVar5 && iVar3 == 0) {
LAB_002049c5:
      archive_set_error(&a->archive,0x54,"Truncated RAR file data");
      *(undefined1 *)((long)pvVar2 + 200) = 0;
      return -1;
    }
  }
  uVar7 = iVar6 - iVar5;
  uVar8 = (ulong)uVar7;
  uVar4 = (uint)(br->cache_buffer >> ((byte)uVar7 & 0x3f)) & cache_masks[iVar5];
  uVar1 = code->table[uVar4].length;
  if (-1 < (int)uVar1) {
    iVar3 = code->table[uVar4].value;
    if ((int)uVar1 <= iVar5) {
      *(uint *)((long)pvVar2 + 0x4ed0) = iVar6 - uVar1;
      return iVar3;
    }
    *(uint *)((long)pvVar2 + 0x4ed0) = uVar7;
    phVar9 = code->tree;
    do {
      iVar6 = (int)uVar8;
      if (phVar9[iVar3].branches[0] == phVar9[iVar3].branches[1]) {
        return phVar9[iVar3].branches[0];
      }
      if (iVar6 < 1) {
        iVar5 = rar_br_fillup(a,br);
        iVar6 = *(int *)((long)pvVar2 + 0x4ed0);
        if (iVar6 < 1 && iVar5 == 0) goto LAB_002049c5;
      }
      uVar8 = (ulong)(iVar6 - 1U);
      *(uint *)((long)pvVar2 + 0x4ed0) = iVar6 - 1U;
      phVar9 = code->tree;
      iVar3 = phVar9[iVar3].branches[(*(ulong *)((long)pvVar2 + 0x4ec8) >> (uVar8 & 0x3f) & 1) != 0]
      ;
    } while (-1 < iVar3);
  }
  archive_set_error(&a->archive,0x54,"Invalid prefix code in bitstream");
  return -1;
}

Assistant:

static int
read_next_symbol(struct archive_read *a, struct huffman_code *code)
{
  unsigned char bit;
  unsigned int bits;
  int length, value, node;
  struct rar *rar;
  struct rar_br *br;

  if (!code->table)
  {
    if (make_table(a, code) != (ARCHIVE_OK))
      return -1;
  }

  rar = (struct rar *)(a->format->data);
  br = &(rar->br);

  /* Look ahead (peek) at bits */
  if (!rar_br_read_ahead(a, br, code->tablesize)) {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Truncated RAR file data");
    rar->valid = 0;
    return -1;
  }
  bits = rar_br_bits(br, code->tablesize);

  length = code->table[bits].length;
  value = code->table[bits].value;

  if (length < 0)
  {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Invalid prefix code in bitstream");
    return -1;
  }

  if (length <= code->tablesize)
  {
    /* Skip length bits */
    rar_br_consume(br, length);
    return value;
  }

  /* Skip tablesize bits */
  rar_br_consume(br, code->tablesize);

  node = value;
  while (!(code->tree[node].branches[0] ==
    code->tree[node].branches[1]))
  {
    if (!rar_br_read_ahead(a, br, 1)) {
      archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                        "Truncated RAR file data");
      rar->valid = 0;
      return -1;
    }
    bit = rar_br_bits(br, 1);
    rar_br_consume(br, 1);

    if (code->tree[node].branches[bit] < 0)
    {
      archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                        "Invalid prefix code in bitstream");
      return -1;
    }
    node = code->tree[node].branches[bit];
  }

  return code->tree[node].branches[0];
}